

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::replaceStreamData
          (QPDFObjectHandle *this,shared_ptr<Buffer> *data,QPDFObjectHandle *filter,
          QPDFObjectHandle *decode_parms)

{
  shared_ptr<Buffer> local_48;
  QPDFObjectHandle local_38;
  QPDFObjectHandle *local_28;
  QPDFObjectHandle *decode_parms_local;
  QPDFObjectHandle *filter_local;
  shared_ptr<Buffer> *data_local;
  QPDFObjectHandle *this_local;
  
  local_28 = decode_parms;
  decode_parms_local = filter;
  filter_local = (QPDFObjectHandle *)data;
  data_local = (shared_ptr<Buffer> *)this;
  as_stream(&local_38,(typed)this);
  std::shared_ptr<Buffer>::shared_ptr(&local_48,data);
  ::qpdf::Stream::replaceStreamData((Stream *)&local_38,&local_48,decode_parms_local,local_28);
  std::shared_ptr<Buffer>::~shared_ptr(&local_48);
  ::qpdf::Stream::~Stream((Stream *)&local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::replaceStreamData(
    std::shared_ptr<Buffer> data,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    as_stream(error).replaceStreamData(data, filter, decode_parms);
}